

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O2

int Utils::getCountOfBytesBeforeNullTerminatorInt(const_iterator it)

{
  long lVar1;
  const_iterator itCopy;
  bool bVar2;
  
  bVar2 = *it._M_current == 0;
  for (lVar1 = 1; (!bVar2 && (it._M_current[lVar1] != 0)); lVar1 = lVar1 + 1) {
    bVar2 = false;
  }
  return (int)lVar1 + 2;
}

Assistant:

int Utils::getCountOfBytesBeforeNullTerminatorInt(std::vector<unsigned int>::const_iterator it) {
    int countBytesBeforeNullTerminated = 0;
    auto itCopy = it;
    // Получаем сколько байт нужно считать до нультермитатора
    while ((int)*itCopy != 0x00 && (int)*(itCopy + 1) != 0x00 ) {
        ++countBytesBeforeNullTerminated;
        ++itCopy;
    }
    return countBytesBeforeNullTerminated + 3;
}